

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

int Extra_FileCheck(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Extra_FileCheck():  File \"%s\" does not exist.\n",pFileName);
    pFileName_local._4_4_ = 0;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    if (lVar1 == 0) {
      printf("Extra_FileCheck():  File \"%s\" is empty.\n",pFileName);
    }
    fclose(__stream);
    pFileName_local._4_4_ = 1;
  }
  return pFileName_local._4_4_;
}

Assistant:

int Extra_FileCheck( char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileCheck():  File \"%s\" does not exist.\n", pFileName );
        return 0;
    }
    fseek( pFile, 0, SEEK_END );
    if ( ftell( pFile ) == 0 )
        printf( "Extra_FileCheck():  File \"%s\" is empty.\n", pFileName );
    fclose( pFile );
    return 1;
}